

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

TransferFormat glu::getTransferFormat(TextureFormat texFormat)

{
  InternalError *this;
  TransferFormat TVar1;
  allocator<char> local_49;
  string local_48;
  char local_21;
  deUint32 local_20;
  deUint32 dStack_1c;
  bool isInt;
  deUint32 type;
  deUint32 format;
  TextureFormat texFormat_local;
  
  dStack_1c = 0;
  local_20 = 0;
  format = texFormat.type;
  if (((format == 0x15) || (format - 0x1b < 5)) || (format == 0x21)) {
    local_21 = '\x01';
  }
  else {
    local_21 = '\0';
  }
  type = texFormat.order;
  switch((ulong)texFormat & 0xffffffff) {
  case 0:
    dStack_1c = 0x1903;
    if (local_21 != '\0') {
      dStack_1c = 0x8d94;
    }
    break;
  case 1:
    dStack_1c = 0x1906;
    break;
  default:
    break;
  case 3:
    dStack_1c = 0x1909;
    break;
  case 4:
    dStack_1c = 0x190a;
    break;
  case 5:
    dStack_1c = 0x8227;
    if (local_21 != '\0') {
      dStack_1c = 0x8228;
    }
    break;
  case 7:
    dStack_1c = 0x1907;
    if (local_21 != '\0') {
      dStack_1c = 0x8d98;
    }
    break;
  case 8:
    dStack_1c = 0x1908;
    if (local_21 != '\0') {
      dStack_1c = 0x8d99;
    }
    break;
  case 0xb:
    dStack_1c = 0x80e1;
    break;
  case 0xc:
    dStack_1c = 0x1903;
    break;
  case 0xd:
    dStack_1c = 0x8227;
    break;
  case 0xe:
    dStack_1c = 0x1907;
    break;
  case 0xf:
    dStack_1c = 0x1908;
    break;
  case 0x12:
    dStack_1c = 0x1902;
    break;
  case 0x13:
    dStack_1c = 0x1901;
    break;
  case 0x14:
    dStack_1c = 0x84f9;
  }
  _type = texFormat;
  switch(format) {
  case 0:
    local_20 = 0x1400;
    break;
  case 1:
    local_20 = 0x1402;
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Can\'t map texture format to GL transfer format",&local_49);
    tcu::InternalError::InternalError(this,&local_48);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  case 3:
    local_20 = 0x1401;
    break;
  case 4:
    local_20 = 0x1403;
    break;
  case 8:
    local_20 = 0x8363;
    break;
  case 10:
    local_20 = 0x8033;
    break;
  case 0xb:
    local_20 = 0x8034;
    break;
  case 0xd:
    local_20 = 0x8368;
    break;
  case 0xf:
    local_20 = 0x8368;
    break;
  case 0x15:
    local_20 = 0x8368;
    break;
  case 0x16:
    local_20 = 0x8c3b;
    break;
  case 0x17:
    local_20 = 0x8c3e;
    break;
  case 0x19:
    local_20 = 0x84fa;
    if (type == 0x12) {
      local_20 = 0x1405;
    }
    break;
  case 0x1b:
    local_20 = 0x1400;
    break;
  case 0x1c:
    local_20 = 0x1402;
    break;
  case 0x1d:
    local_20 = 0x1404;
    break;
  case 0x1e:
    local_20 = 0x1401;
    break;
  case 0x1f:
    local_20 = 0x1403;
    break;
  case 0x21:
    local_20 = 0x1405;
    break;
  case 0x22:
    local_20 = 0x140b;
    break;
  case 0x23:
    local_20 = 0x1406;
    break;
  case 0x25:
    local_20 = 0x8dad;
  }
  TransferFormat::TransferFormat((TransferFormat *)&texFormat_local,dStack_1c,local_20);
  TVar1.format = texFormat_local.order;
  TVar1.dataType = texFormat_local.type;
  return TVar1;
}

Assistant:

TransferFormat getTransferFormat (tcu::TextureFormat texFormat)
{
	using tcu::TextureFormat;

	deUint32	format	= GL_NONE;
	deUint32	type	= GL_NONE;
	bool		isInt	= false;

	switch (texFormat.type)
	{
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			isInt = true;
			break;

		default:
			isInt = false;
			break;
	}

	switch (texFormat.order)
	{
		case TextureFormat::A:		format = GL_ALPHA;								break;
		case TextureFormat::L:		format = GL_LUMINANCE;							break;
		case TextureFormat::LA:		format = GL_LUMINANCE_ALPHA;					break;
		case TextureFormat::R:		format = isInt ? GL_RED_INTEGER		: GL_RED;	break;
		case TextureFormat::RG:		format = isInt ? GL_RG_INTEGER		: GL_RG;	break;
		case TextureFormat::RGB:	format = isInt ? GL_RGB_INTEGER		: GL_RGB;	break;
		case TextureFormat::RGBA:	format = isInt ? GL_RGBA_INTEGER	: GL_RGBA;	break;
		case TextureFormat::sR:		format = GL_RED;								break;
		case TextureFormat::sRG:	format = GL_RG;									break;
		case TextureFormat::sRGB:	format = GL_RGB;								break;
		case TextureFormat::sRGBA:	format = GL_RGBA;								break;
		case TextureFormat::D:		format = GL_DEPTH_COMPONENT;					break;
		case TextureFormat::DS:		format = GL_DEPTH_STENCIL;						break;
		case TextureFormat::S:		format = GL_STENCIL_INDEX;						break;

		case TextureFormat::BGRA:
			DE_ASSERT(!isInt);
			format = GL_BGRA;
			break;

		default:
			DE_ASSERT(false);
	}

	switch (texFormat.type)
	{
		case TextureFormat::SNORM_INT8:						type = GL_BYTE;								break;
		case TextureFormat::SNORM_INT16:					type = GL_SHORT;							break;
		case TextureFormat::UNORM_INT8:						type = GL_UNSIGNED_BYTE;					break;
		case TextureFormat::UNORM_INT16:					type = GL_UNSIGNED_SHORT;					break;
		case TextureFormat::UNORM_SHORT_565:				type = GL_UNSIGNED_SHORT_5_6_5;				break;
		case TextureFormat::UNORM_SHORT_4444:				type = GL_UNSIGNED_SHORT_4_4_4_4;			break;
		case TextureFormat::UNORM_SHORT_5551:				type = GL_UNSIGNED_SHORT_5_5_5_1;			break;
		case TextureFormat::SIGNED_INT8:					type = GL_BYTE;								break;
		case TextureFormat::SIGNED_INT16:					type = GL_SHORT;							break;
		case TextureFormat::SIGNED_INT32:					type = GL_INT;								break;
		case TextureFormat::UNSIGNED_INT8:					type = GL_UNSIGNED_BYTE;					break;
		case TextureFormat::UNSIGNED_INT16:					type = GL_UNSIGNED_SHORT;					break;
		case TextureFormat::UNSIGNED_INT32:					type = GL_UNSIGNED_INT;						break;
		case TextureFormat::FLOAT:							type = GL_FLOAT;							break;
		case TextureFormat::UNORM_INT_101010:				type = GL_UNSIGNED_INT_2_10_10_10_REV;		break;
		case TextureFormat::UNORM_INT_1010102_REV:			type = GL_UNSIGNED_INT_2_10_10_10_REV;		break;
		case TextureFormat::UNSIGNED_INT_1010102_REV:		type = GL_UNSIGNED_INT_2_10_10_10_REV;		break;
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	type = GL_UNSIGNED_INT_10F_11F_11F_REV;		break;
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		type = GL_UNSIGNED_INT_5_9_9_9_REV;			break;
		case TextureFormat::HALF_FLOAT:						type = GL_HALF_FLOAT;						break;
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	type = GL_FLOAT_32_UNSIGNED_INT_24_8_REV;	break;
		case TextureFormat::UNSIGNED_INT_24_8:				type = texFormat.order == TextureFormat::D
																 ? GL_UNSIGNED_INT
																 : GL_UNSIGNED_INT_24_8;				break;

		default:
			throw tcu::InternalError("Can't map texture format to GL transfer format");
	}

	return TransferFormat(format, type);
}